

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::
     mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  char *pcVar1;
  iterator *piVar2;
  iterator last_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  iterator last_01;
  BitmapArray<long> *pBVar3;
  BitmapArray<long> *pBVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  _Elt_pointer psVar8;
  BitmapArray<long> *pBVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  ulong uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  pos_type pVar14;
  pos_type pVar15;
  char cVar16;
  long lVar17;
  int iVar18;
  iterator first2;
  iterator first_00;
  iterator last_02;
  iterator last_03;
  iterator PA_00;
  iterator PA_01;
  iterator PA_02;
  iterator PA_03;
  iterator iVar19;
  iterator iVar20;
  iterator a;
  iterator c;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_130;
  BitmapArray<long> *local_100;
  iterator local_f8;
  pos_type local_e0;
  iterator local_d8;
  BitmapArray<long> *local_c0;
  pos_type local_b8;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
  *local_b0;
  pos_type local_a8;
  char *local_a0;
  BitmapArray<long> *local_98;
  char *local_90;
  pos_type local_88;
  BitmapArray<long> *local_80;
  char *local_78;
  BitmapArray<long> *pBStack_70;
  pos_type local_68;
  char *local_60;
  BitmapArray<long> *pBStack_58;
  pos_type local_50;
  char *local_48;
  BitmapArray<long> *pBStack_40;
  pos_type local_38;
  
  local_b8 = PA.pos_;
  local_98 = PA.array_;
  local_f8 = (iterator)ZEXT816(0);
  local_d8.array_ = (BitmapArray<long> *)0x0;
  local_d8.pos_ = 0;
  uVar10 = last.pos_ - first.pos_;
  iVar18 = 0;
  if (0xff < (long)uVar10) {
    iVar18 = 0;
    uVar12 = uVar10;
    do {
      iVar18 = iVar18 + 8;
      uVar10 = uVar12 >> 8;
      bVar5 = 0xffff < uVar12;
      uVar12 = uVar10;
    } while (bVar5);
  }
  iVar18 = iVar18 + (&helper::log2table)[uVar10];
  local_b0 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              *)stack;
  local_90 = T;
  do {
    while( true ) {
      while( true ) {
        pBVar4 = local_98;
        pVar15 = first.pos_;
        local_100 = first.array_;
        pBVar3 = local_100;
        lVar13 = last.pos_ - pVar15;
        local_e0 = pVar15;
        if (8 < lVar13) break;
        if (1 < lVar13) {
          last_00.pos_ = last.pos_;
          last_00.array_ = last.array_;
          PA_00.pos_ = local_b8;
          PA_00.array_ = local_98;
          insertionsort<char*,bitmap::BitmapArray<long>::iterator>
                    (local_90,PA_00,first,last_00,depth);
        }
        psVar8 = *(_Elt_pointer *)((long)stack + 0x30);
        if (psVar8 == *(_Elt_pointer *)((long)stack + 0x10)) {
          return;
        }
        if (psVar8 == *(_Elt_pointer *)((long)stack + 0x38)) {
          psVar8 = (*(_Map_pointer *)((long)stack + 0x48))[-1] + 10;
        }
        local_100 = psVar8[-1].m_a.array_;
        pVar15 = psVar8[-1].m_a.pos_;
        last.array_ = psVar8[-1].m_b.array_;
        last.pos_ = psVar8[-1].m_b.pos_;
        depth = psVar8[-1].m_c;
        iVar18 = psVar8[-1].m_d;
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>
        ::pop_back(&stack->c);
        first.pos_ = pVar15;
        first.array_ = local_100;
      }
      pcVar1 = local_90 + depth;
      iVar6 = iVar18 + -1;
      local_c0 = (BitmapArray<long> *)depth;
      if (iVar18 != 0) break;
      pBStack_40 = local_98;
      local_38 = local_b8;
      Td.m_PA.array_ = local_98;
      Td.m_Td = pcVar1;
      Td.m_PA.pos_ = local_b8;
      local_48 = pcVar1;
      helper::
      heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                (Td,first,lVar13);
LAB_00106a6c:
      local_f8.pos_ = pVar15 + 1;
      local_f8.array_ = pBVar3;
      local_100 = pBVar3;
      iVar18 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar15);
      pVar14 = local_b8;
      iVar18 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar4,CONCAT44(extraout_var_07,iVar18) + local_b8);
      cVar16 = pcVar1[CONCAT44(extraout_var_08,iVar18)];
      pVar15 = local_e0;
      uVar10 = local_f8.pos_;
      while (uVar10 < last.pos_) {
        iVar18 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
        iVar18 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                           (pBVar4,CONCAT44(extraout_var_09,iVar18) + pVar14);
        if (pcVar1[CONCAT44(extraout_var_10,iVar18)] != cVar16) {
          if (1 < (long)(local_f8.pos_ - pVar15)) break;
          local_100 = local_f8.array_;
          pVar15 = local_f8.pos_;
          cVar16 = pcVar1[CONCAT44(extraout_var_10,iVar18)];
        }
        uVar10 = local_f8.pos_ + 1;
        local_f8.pos_ = uVar10;
      }
      pBVar3 = local_100;
      iVar18 = (*(local_100->super_Bitmap)._vptr_Bitmap[5])(local_100,pVar15);
      iVar18 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar4,CONCAT44(extraout_var_11,iVar18) + pVar14);
      first.pos_ = pVar15;
      first.array_ = local_100;
      if (pcVar1[CONCAT44(extraout_var_12,iVar18) + -1] < cVar16) {
        first_00.pos_ = pVar15;
        first_00.array_ = pBVar3;
        PA_02.pos_ = pVar14;
        PA_02.array_ = pBVar4;
        first = partition<bitmap::BitmapArray<long>::iterator>
                          (PA_02,first_00,local_f8,(value_type)local_c0);
      }
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_b0;
      depth = (value_type)local_c0;
      pVar15 = first.pos_;
      local_100 = first.array_;
      uVar10 = local_f8.pos_ - pVar15;
      if ((long)(last.pos_ - local_f8.pos_) < (long)uVar10) {
        if ((long)(last.pos_ - local_f8.pos_) < 2) {
          last.array_ = local_f8.array_;
          iVar18 = 0;
          if (0xff < (long)uVar10) {
            iVar18 = 0;
            uVar12 = uVar10;
            do {
              iVar18 = iVar18 + 8;
              uVar10 = uVar12 >> 8;
              bVar5 = 0xffff < uVar12;
              uVar12 = uVar10;
            } while (bVar5);
          }
          depth = (long)&(local_c0->super_Bitmap)._vptr_Bitmap + 1;
          iVar18 = iVar18 + (&helper::log2table)[uVar10];
          last.pos_ = local_f8.pos_;
        }
        else {
          local_130.m_d = 0;
          if (0xff < (long)uVar10) {
            local_130.m_d = 0;
            uVar12 = uVar10;
            do {
              local_130.m_d = local_130.m_d + 8;
              uVar10 = uVar12 >> 8;
              bVar5 = 0xffff < uVar12;
              uVar12 = uVar10;
            } while (bVar5);
          }
          local_130.m_c = (long)&(local_c0->super_Bitmap)._vptr_Bitmap + 1;
          local_130.m_d = local_130.m_d + (&helper::log2table)[uVar10];
          local_130.m_b.array_ = local_f8.array_;
          local_130.m_b.pos_ = local_f8.pos_;
          piVar2 = *(iterator **)(local_b0 + 0x30);
          local_130.m_a = first;
          if (piVar2 == (iterator *)(*(long *)(local_b0 + 0x40) + -0x30)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_130);
          }
          else {
            piVar2[2].array_ = (BitmapArray<long> *)local_130.m_c;
            piVar2[2].pos_ = CONCAT44(local_130._44_4_,local_130.m_d);
            piVar2[1].array_ = local_f8.array_;
            piVar2[1].pos_ = local_f8.pos_;
            *piVar2 = first;
            *(long *)(local_b0 + 0x30) = *(long *)(local_b0 + 0x30) + 0x30;
          }
          first.pos_ = local_f8.pos_;
          first.array_ = local_f8.array_;
          iVar18 = -1;
        }
      }
      else if ((long)uVar10 < 2) {
        iVar18 = -1;
        first = local_f8;
      }
      else {
        local_130.m_a = local_f8;
        local_130.m_b.array_ = last.array_;
        local_130.m_b.pos_ = last.pos_;
        local_130.m_c = (long)local_c0;
        local_130.m_d = -1;
        puVar11 = *(undefined8 **)(local_b0 + 0x30);
        if (puVar11 == (undefined8 *)(*(long *)(local_b0 + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_b0,&local_130);
          uVar10 = local_f8.pos_ - pVar15;
        }
        else {
          puVar11[4] = local_c0;
          puVar11[5] = CONCAT44(local_130._44_4_,0xffffffff);
          puVar11[2] = last.array_;
          puVar11[3] = last.pos_;
          *puVar11 = local_f8.array_;
          puVar11[1] = local_f8.pos_;
          *(long *)(local_b0 + 0x30) = *(long *)(local_b0 + 0x30) + 0x30;
        }
        first.pos_ = pVar15;
        first.array_ = local_100;
        iVar18 = 0;
        if (0xff < (long)uVar10) {
          iVar18 = 0;
          uVar12 = uVar10;
          do {
            iVar18 = iVar18 + 8;
            uVar10 = uVar12 >> 8;
            bVar5 = 0xffff < uVar12;
            uVar12 = uVar10;
          } while (bVar5);
        }
        depth = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
        iVar18 = iVar18 + (&helper::log2table)[uVar10];
        last.array_ = local_f8.array_;
        last.pos_ = local_f8.pos_;
      }
    }
    if (iVar18 < 1) goto LAB_00106a6c;
    pBStack_58 = local_98;
    local_50 = local_b8;
    Td_00.m_PA.array_ = local_98;
    Td_00.m_Td = pcVar1;
    Td_00.m_PA.pos_ = local_b8;
    iVar19.pos_ = last.pos_;
    iVar19.array_ = last.array_;
    local_60 = pcVar1;
    local_f8 = helper::
               pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                         (Td_00,first,iVar19);
    pVar14 = local_f8.pos_;
    pBVar9 = local_f8.array_;
    local_a0 = pcVar1;
    iVar7 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar15);
    local_a8 = CONCAT44(extraout_var,iVar7);
    iVar7 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar14);
    (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,pVar15,CONCAT44(extraout_var_00,iVar7));
    (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,pVar14,local_a8);
    pcVar1 = local_a0;
    pVar14 = local_b8;
    local_78 = local_a0;
    pBStack_70 = pBVar4;
    local_68 = local_b8;
    local_a8 = pVar15 + 1;
    local_80 = last.array_;
    local_88 = last.pos_;
    iVar7 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar15);
    iVar7 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar4,CONCAT44(extraout_var_01,iVar7) + pVar14);
    Td_01.m_PA.array_ = pBStack_70;
    Td_01.m_Td = local_78;
    Td_01.m_PA.pos_ = local_68;
    first2.pos_ = local_a8;
    first2.array_ = pBVar3;
    last_02.pos_ = local_88;
    last_02.array_ = local_80;
    bVar5 = helper::
            partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                      (Td_01,first,first2,last_02,&local_f8,&local_d8,
                       pcVar1 + CONCAT44(extraout_var_02,iVar7));
    if (bVar5) {
      iVar18 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_f8.array_,local_f8.pos_);
      pVar15 = local_b8;
      iVar18 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar4,CONCAT44(extraout_var_03,iVar18) + local_b8);
      pcVar1 = local_a0;
      cVar16 = local_a0[CONCAT44(extraout_var_04,iVar18)];
      iVar18 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_f8.array_,local_f8.pos_);
      iVar18 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar4,CONCAT44(extraout_var_05,iVar18) + pVar15);
      depth = (value_type)local_c0;
      iVar19 = local_f8;
      if (pcVar1[CONCAT44(extraout_var_06,iVar18) + -1] < cVar16) {
        last_01.pos_ = local_d8.pos_;
        last_01.array_ = local_d8.array_;
        PA_01.pos_ = pVar15;
        PA_01.array_ = pBVar4;
        iVar19 = partition<bitmap::BitmapArray<long>::iterator>
                           (PA_01,local_f8,last_01,(value_type)local_c0);
      }
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_b0;
      pBVar3 = local_100;
      pVar15 = iVar19.pos_;
      lVar13 = local_f8.pos_ - local_e0;
      lVar17 = last.pos_ - local_d8.pos_;
      uVar10 = local_d8.pos_ - pVar15;
      local_130.m_b.pos_ = local_f8.pos_;
      iVar18 = iVar6;
      local_130.m_a = iVar19;
      local_130.m_d = iVar6;
      if (lVar17 < lVar13) {
        if ((long)uVar10 < lVar13) {
          if ((long)uVar10 < lVar17) {
            local_130.m_a.array_ = local_100;
            local_130.m_a.pos_ = local_e0;
            local_130.m_b.array_ = local_f8.array_;
            local_130.m_c = depth;
            puVar11 = *(undefined8 **)(local_b0 + 0x30);
            if (puVar11 == (undefined8 *)(*(long *)(local_b0 + 0x40) + -0x30)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                        (local_b0,&local_130);
              puVar11 = *(undefined8 **)((long)stack + 0x30);
            }
            else {
              puVar11[4] = depth;
              puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
              puVar11[2] = local_f8.array_;
              puVar11[3] = local_f8.pos_;
              *puVar11 = local_100;
              puVar11[1] = local_e0;
              puVar11 = (undefined8 *)(*(long *)(local_b0 + 0x30) + 0x30);
              *(undefined8 **)(local_b0 + 0x30) = puVar11;
            }
            local_130.m_a.pos_ = local_d8.pos_;
            local_130.m_a.array_ = local_d8.array_;
            local_130.m_b.array_ = last.array_;
            local_130.m_b.pos_ = last.pos_;
            local_130.m_c = depth;
            if (puVar11 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
              local_130.m_d = iVar6;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                          *)stack,&local_130);
            }
            else {
              puVar11[4] = depth;
              puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
              puVar11[2] = last.array_;
              puVar11[3] = last.pos_;
              *puVar11 = local_d8.array_;
              puVar11[1] = local_d8.pos_;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
              local_130.m_d = iVar6;
            }
            uVar10 = local_d8.pos_ - pVar15;
            if ((long)uVar10 < 0x100) goto LAB_001076bd;
            iVar18 = 0;
            uVar12 = uVar10;
            do {
              iVar18 = iVar18 + 8;
              uVar10 = uVar12 >> 8;
              bVar5 = 0xffff < uVar12;
              uVar12 = uVar10;
            } while (bVar5);
LAB_001076c0:
            depth = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
            iVar18 = iVar18 + (&helper::log2table)[uVar10];
            last.array_ = local_d8.array_;
            last.pos_ = local_d8.pos_;
            first = iVar19;
          }
          else {
            local_130.m_a.pos_ = local_e0;
            local_130.m_a.array_ = local_100;
            local_130.m_b.array_ = local_f8.array_;
            local_130.m_c = depth;
            puVar11 = *(undefined8 **)(local_b0 + 0x30);
            if (puVar11 == (undefined8 *)(*(long *)(local_b0 + 0x40) + -0x30)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                        (local_b0,&local_130);
              uVar10 = local_d8.pos_ - pVar15;
            }
            else {
              puVar11[4] = depth;
              puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
              puVar11[2] = local_f8.array_;
              puVar11[3] = local_f8.pos_;
              *puVar11 = local_100;
              puVar11[1] = local_e0;
              *(long *)(local_b0 + 0x30) = *(long *)(local_b0 + 0x30) + 0x30;
            }
            local_130.m_b.array_ = local_d8.array_;
            local_130.m_d = 0;
            if (0xff < (long)uVar10) {
              local_130.m_d = 0;
              uVar12 = uVar10;
              do {
                local_130.m_d = local_130.m_d + 8;
                uVar10 = uVar12 >> 8;
                bVar5 = 0xffff < uVar12;
                uVar12 = uVar10;
              } while (bVar5);
            }
            local_130.m_c = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
            local_130.m_d = local_130.m_d + (&helper::log2table)[uVar10];
            local_130.m_b.pos_ = local_d8.pos_;
            piVar2 = *(iterator **)((long)stack + 0x30);
            if (piVar2 == (iterator *)(*(long *)((long)stack + 0x40) + -0x30)) {
              local_130.m_a = iVar19;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                          *)stack,&local_130);
              first.pos_ = local_d8.pos_;
              first.array_ = local_d8.array_;
            }
            else {
              first.pos_ = local_d8.pos_;
              first.array_ = local_d8.array_;
              piVar2[2].array_ = (BitmapArray<long> *)local_130.m_c;
              piVar2[2].pos_ = CONCAT44(local_130._44_4_,local_130.m_d);
              piVar2[1].array_ = local_d8.array_;
              piVar2[1].pos_ = local_d8.pos_;
              *piVar2 = iVar19;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
              local_130.m_a = iVar19;
            }
          }
        }
        else {
          local_130.m_d = 0;
          if (0xff < (long)uVar10) {
            local_130.m_d = 0;
            uVar12 = uVar10;
            do {
              local_130.m_d = local_130.m_d + 8;
              uVar10 = uVar12 >> 8;
              bVar5 = 0xffff < uVar12;
              uVar12 = uVar10;
            } while (bVar5);
          }
          local_130.m_c = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
          local_130.m_d = local_130.m_d + (&helper::log2table)[uVar10];
          local_130.m_b.array_ = local_d8.array_;
          local_130.m_b.pos_ = local_d8.pos_;
          piVar2 = *(iterator **)(local_b0 + 0x30);
          if (piVar2 == (iterator *)(*(long *)(local_b0 + 0x40) + -0x30)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_130);
            puVar11 = *(undefined8 **)((long)stack + 0x30);
            local_130.m_b.pos_ = local_f8.pos_;
          }
          else {
            piVar2[2].array_ = (BitmapArray<long> *)local_130.m_c;
            piVar2[2].pos_ = CONCAT44(local_130._44_4_,local_130.m_d);
            piVar2[1].array_ = local_d8.array_;
            piVar2[1].pos_ = local_d8.pos_;
            *piVar2 = iVar19;
            puVar11 = (undefined8 *)(*(long *)(local_b0 + 0x30) + 0x30);
            *(undefined8 **)(local_b0 + 0x30) = puVar11;
            local_130.m_b.pos_ = local_f8.pos_;
          }
          local_130.m_a.pos_ = local_e0;
          local_130.m_a.array_ = pBVar3;
          local_130.m_b.array_ = local_f8.array_;
          local_130.m_c = depth;
          if (puVar11 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
            local_130.m_d = iVar6;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_130);
          }
          else {
            puVar11[4] = depth;
            puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
            puVar11[2] = local_f8.array_;
            puVar11[3] = local_130.m_b.pos_;
            *puVar11 = pBVar3;
            puVar11[1] = local_e0;
            *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
            local_130.m_d = iVar6;
          }
          first.pos_ = local_d8.pos_;
          first.array_ = local_d8.array_;
        }
      }
      else if ((long)uVar10 < lVar17) {
        if ((long)uVar10 < lVar13) {
          local_130.m_a.array_ = local_d8.array_;
          local_130.m_a.pos_ = local_d8.pos_;
          local_130.m_b.array_ = last.array_;
          local_130.m_b.pos_ = last.pos_;
          local_130.m_c = depth;
          puVar11 = *(undefined8 **)(local_b0 + 0x30);
          if (puVar11 == (undefined8 *)(*(long *)(local_b0 + 0x40) + -0x30)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      (local_b0,&local_130);
            puVar11 = *(undefined8 **)((long)stack + 0x30);
            local_130.m_b.pos_ = local_f8.pos_;
          }
          else {
            puVar11[4] = depth;
            puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
            puVar11[2] = last.array_;
            puVar11[3] = last.pos_;
            *puVar11 = local_d8.array_;
            puVar11[1] = local_d8.pos_;
            puVar11 = (undefined8 *)(*(long *)(local_b0 + 0x30) + 0x30);
            *(undefined8 **)(local_b0 + 0x30) = puVar11;
            local_130.m_b.pos_ = local_f8.pos_;
          }
          local_130.m_a.pos_ = local_e0;
          local_130.m_a.array_ = pBVar3;
          local_130.m_b.array_ = local_f8.array_;
          local_130.m_c = depth;
          if (puVar11 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
            local_130.m_d = iVar6;
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                        *)stack,&local_130);
          }
          else {
            puVar11[4] = depth;
            puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
            puVar11[2] = local_f8.array_;
            puVar11[3] = local_130.m_b.pos_;
            *puVar11 = pBVar3;
            puVar11[1] = local_e0;
            *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
            local_130.m_d = iVar6;
          }
          uVar10 = local_d8.pos_ - pVar15;
          if ((long)uVar10 < 0x100) {
LAB_001076bd:
            iVar18 = 0;
          }
          else {
            iVar18 = 0;
            uVar12 = uVar10;
            do {
              iVar18 = iVar18 + 8;
              uVar10 = uVar12 >> 8;
              bVar5 = 0xffff < uVar12;
              uVar12 = uVar10;
            } while (bVar5);
          }
          goto LAB_001076c0;
        }
        local_130.m_a.pos_ = local_d8.pos_;
        local_130.m_a.array_ = local_d8.array_;
        local_130.m_b.array_ = last.array_;
        local_130.m_b.pos_ = last.pos_;
        local_130.m_c = depth;
        puVar11 = *(undefined8 **)(local_b0 + 0x30);
        if (puVar11 == (undefined8 *)(*(long *)(local_b0 + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_b0,&local_130);
          uVar10 = local_d8.pos_ - pVar15;
        }
        else {
          puVar11[4] = depth;
          puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
          puVar11[2] = last.array_;
          puVar11[3] = last.pos_;
          *puVar11 = local_d8.array_;
          puVar11[1] = local_d8.pos_;
          *(long *)(local_b0 + 0x30) = *(long *)(local_b0 + 0x30) + 0x30;
        }
        local_130.m_d = 0;
        if (0xff < (long)uVar10) {
          local_130.m_d = 0;
          uVar12 = uVar10;
          do {
            local_130.m_d = local_130.m_d + 8;
            uVar10 = uVar12 >> 8;
            bVar5 = 0xffff < uVar12;
            uVar12 = uVar10;
          } while (bVar5);
        }
        local_130.m_c = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
        local_130.m_d = local_130.m_d + (&helper::log2table)[uVar10];
        local_130.m_b.array_ = local_d8.array_;
        local_130.m_b.pos_ = local_d8.pos_;
        piVar2 = *(iterator **)((long)stack + 0x30);
        if (piVar2 == (iterator *)(*(long *)((long)stack + 0x40) + -0x30)) {
          local_130.m_a = iVar19;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_130);
        }
        else {
          piVar2[2].array_ = (BitmapArray<long> *)local_130.m_c;
          piVar2[2].pos_ = CONCAT44(local_130._44_4_,local_130.m_d);
          piVar2[1].array_ = local_d8.array_;
          piVar2[1].pos_ = local_d8.pos_;
          *piVar2 = iVar19;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
          local_130.m_a = iVar19;
        }
        last.array_ = local_f8.array_;
        last.pos_ = local_f8.pos_;
        first.pos_ = local_e0;
        first.array_ = local_100;
      }
      else {
        local_130.m_d = 0;
        if (0xff < (long)uVar10) {
          local_130.m_d = 0;
          uVar12 = uVar10;
          do {
            local_130.m_d = local_130.m_d + 8;
            uVar10 = uVar12 >> 8;
            bVar5 = 0xffff < uVar12;
            uVar12 = uVar10;
          } while (bVar5);
        }
        local_130.m_c = (long)&(((BitmapArray<long> *)depth)->super_Bitmap)._vptr_Bitmap + 1;
        local_130.m_d = local_130.m_d + (&helper::log2table)[uVar10];
        local_130.m_b.array_ = local_d8.array_;
        local_130.m_b.pos_ = local_d8.pos_;
        piVar2 = *(iterator **)(local_b0 + 0x30);
        if (piVar2 == (iterator *)(*(long *)(local_b0 + 0x40) + -0x30)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    (local_b0,&local_130);
          puVar11 = *(undefined8 **)((long)stack + 0x30);
        }
        else {
          piVar2[2].array_ = (BitmapArray<long> *)local_130.m_c;
          piVar2[2].pos_ = CONCAT44(local_130._44_4_,local_130.m_d);
          piVar2[1].array_ = local_d8.array_;
          piVar2[1].pos_ = local_d8.pos_;
          *piVar2 = iVar19;
          puVar11 = (undefined8 *)(*(long *)(local_b0 + 0x30) + 0x30);
          *(undefined8 **)(local_b0 + 0x30) = puVar11;
        }
        local_130.m_a.pos_ = local_d8.pos_;
        local_130.m_a.array_ = local_d8.array_;
        local_130.m_b.array_ = last.array_;
        local_130.m_b.pos_ = last.pos_;
        local_130.m_c = depth;
        if (puVar11 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x30)) {
          local_130.m_d = iVar6;
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>
                      *)stack,&local_130);
        }
        else {
          puVar11[4] = depth;
          puVar11[5] = CONCAT44(local_130._44_4_,iVar6);
          puVar11[2] = last.array_;
          puVar11[3] = last.pos_;
          *puVar11 = local_d8.array_;
          puVar11[1] = local_d8.pos_;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x30;
          local_130.m_d = iVar6;
        }
        last.array_ = local_f8.array_;
        last.pos_ = local_f8.pos_;
        first.pos_ = local_e0;
        first.array_ = local_100;
      }
    }
    else {
      iVar6 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar15);
      pVar14 = local_b8;
      iVar6 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar4,CONCAT44(extraout_var_13,iVar6) + local_b8);
      pcVar1 = local_a0;
      local_a8 = CONCAT71(local_a8._1_7_,local_a0[CONCAT44(extraout_var_14,iVar6) + -1]);
      iVar6 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar15);
      iVar6 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar4,CONCAT44(extraout_var_15,iVar6) + pVar14);
      iVar20.pos_ = local_e0;
      iVar20.array_ = local_100;
      if ((char)local_a8 < pcVar1[CONCAT44(extraout_var_16,iVar6)]) {
        last_03.pos_ = last.pos_;
        last_03.array_ = last.array_;
        PA_03.pos_ = local_b8;
        PA_03.array_ = pBVar4;
        iVar20 = partition<bitmap::BitmapArray<long>::iterator>
                           (PA_03,first,last_03,(value_type)local_c0);
        uVar10 = last.pos_ - iVar20.pos_;
        iVar18 = 0;
        if (0xff < (long)uVar10) {
          iVar18 = 0;
          uVar12 = uVar10;
          do {
            iVar18 = iVar18 + 8;
            uVar10 = uVar12 >> 8;
            bVar5 = 0xffff < uVar12;
            uVar12 = uVar10;
          } while (bVar5);
        }
        iVar18 = iVar18 + (&helper::log2table)[uVar10];
      }
      first = iVar20;
      depth = (long)&(local_c0->super_Bitmap)._vptr_Bitmap + 1;
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)local_b0;
    }
  } while( true );
}

Assistant:

void mintrosort(
    stack_type &stack, const StringIterator_type T, const SAIterator_type PA,
    SAIterator_type first, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  typedef substring_wrapper<StringIterator_type, SAIterator_type> wrapper_type;
  typedef typename stack_type::value_type stackinfo_type;

  SAIterator_type a, b, c;
  value_type v, x;
  int limit;

  for (limit = helper::lg(last - first);;) {

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        insertionsort(T, PA, first, last, depth);
      }
      STACK_POP4(first, last, depth, limit);
      continue;
    }

    const StringIterator_type Td = T + depth;
    if (limit-- == 0) {
      helper::heapsort(wrapper_type(Td, PA), first, last - first);
    }
    if (limit < 0) {
      for (a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if ((x = Td[PA[*a]]) != v) {
          if (1 < (a - first)) {
            break;
          }
          v = x;
          first = a;
        }
      }
      if (Td[PA[*first] - 1] < v) {
        first = partition(PA, first, a, depth);
      }
      if ((a - first) <= (last - a)) {
        if (1 < (a - first)) {
          STACK_PUSH4(a, last, depth, -1);
          last = a, depth += 1, limit = helper::lg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if (1 < (last - a)) {
          STACK_PUSH4(first, a, depth + 1, helper::lg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = helper::lg(a - first);
        }
      }
      continue;
    }

    /* partition */
    a = helper::pivot(wrapper_type(Td, PA), first, last);
    std::iter_swap(first, a);
    if (helper::partition(wrapper_type(Td, PA), first, first + 1, last, a, c,
                          Td[PA[*first]]) != false) {
      b = (Td[PA[*a]] <= Td[PA[*a] - 1]) ? a : partition(PA, a, c, depth);

      if ((a - first) <= (last - c)) {
        if ((last - c) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(c, last, depth, limit);
          last = a;
        } else if ((a - first) <= (c - b)) {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          last = a;
        } else {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      } else {
        if ((a - first) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(first, a, depth, limit);
          first = c;
        } else if ((last - c) <= (c - b)) {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          first = c;
        } else {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      }
    } else {
      limit += 1;
      if (Td[PA[*first] - 1] < Td[PA[*first]]) {
        first = partition(PA, first, last, depth);
        limit = helper::lg(last - first);
      }
      depth += 1;
    }
  }
}